

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void CountTest<uttt::IBoard>(int depth)

{
  ostream *poVar1;
  int depth_00;
  bool bVar2;
  
  depth_00 = 0;
  if (depth < 1) {
    depth = depth_00;
  }
  while (bVar2 = depth != 0, depth = depth + -1, bVar2) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Working on depth: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,depth_00 + 1);
    std::operator<<(poVar1,'\n');
    std::chrono::_V2::system_clock::now();
    game::Count<uttt::IBoard>(depth_00);
    std::chrono::_V2::system_clock::now();
    poVar1 = std::operator<<((ostream *)&std::cout,"Count: ");
    poVar1 = std::ostream::_M_insert<long_long>((longlong)poVar1);
    std::operator<<(poVar1,'\n');
    poVar1 = std::operator<<((ostream *)&std::cout,"Duration: ");
    poVar1 = std::ostream::_M_insert<long_long>((longlong)poVar1);
    poVar1 = std::operator<<(poVar1," seconds ");
    poVar1 = std::ostream::_M_insert<long_long>((longlong)poVar1);
    std::operator<<(poVar1," milliseconds\n");
    std::chrono::_V2::system_clock::now();
    game::CountBFS<uttt::IBoard>(depth_00);
    std::chrono::_V2::system_clock::now();
    poVar1 = std::operator<<((ostream *)&std::cout,"DFS count: ");
    poVar1 = std::ostream::_M_insert<long_long>((longlong)poVar1);
    std::operator<<(poVar1,'\n');
    poVar1 = std::operator<<((ostream *)&std::cout,"Duration: ");
    poVar1 = std::ostream::_M_insert<long_long>((longlong)poVar1);
    poVar1 = std::operator<<(poVar1," seconds ");
    poVar1 = std::ostream::_M_insert<long_long>((longlong)poVar1);
    std::operator<<(poVar1," milliseconds\n");
    depth_00 = depth_00 + 1;
  }
  return;
}

Assistant:

void
CountTest(int depth)
{
    for (int i = 0; i < depth; ++i)
    {
        std::cout << "Working on depth: " << i + 1 << '\n';

        auto t1 = std::chrono::high_resolution_clock::now();
        auto r = game::Count<IGame>(i);
        auto t2 = std::chrono::high_resolution_clock::now();
        long long millis = std::chrono::duration_cast<std::chrono::milliseconds>(t2 - t1).count();
        std::cout << "Count: " << r << '\n';
        std::cout << "Duration: " << millis / 1000 << " seconds " << millis % 1000 << " milliseconds\n";

        t1 = std::chrono::high_resolution_clock::now();
        auto count = game::CountBFS<IGame>(i);
        t2 = std::chrono::high_resolution_clock::now();
        std::cout << "DFS count: " << count << '\n';
        millis = std::chrono::duration_cast<std::chrono::milliseconds>(t2 - t1).count();
        std::cout << "Duration: " << millis / 1000 << " seconds " << millis % 1000 << " milliseconds\n";
    }
}